

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.cpp
# Opt level: O0

vector_type * __thiscall
nanoNet::NeuralNetwork::predict
          (vector_type *__return_storage_ptr__,NeuralNetwork *this,vector_type *inputData)

{
  bool bVar1;
  vector_type local_60;
  reference local_48;
  NeuralNetworkLayer *layer;
  const_iterator __end1;
  const_iterator __begin1;
  vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_> *__range1;
  vector_type *inputData_local;
  NeuralNetwork *this_local;
  vector_type *result;
  
  std::vector<float,_std::allocator<float>_>::vector(__return_storage_ptr__,inputData);
  __end1 = std::vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>::
           begin(&this->m_layers);
  layer = (NeuralNetworkLayer *)
          std::vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>::
          end(&this->m_layers);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_nanoNet::NeuralNetworkLayer_*,_std::vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>_>
                                     *)&layer), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_nanoNet::NeuralNetworkLayer_*,_std::vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>_>
               ::operator*(&__end1);
    NeuralNetworkLayer::predict(&local_60,local_48,__return_storage_ptr__);
    std::vector<float,_std::allocator<float>_>::operator=(__return_storage_ptr__,&local_60);
    std::vector<float,_std::allocator<float>_>::~vector(&local_60);
    __gnu_cxx::
    __normal_iterator<const_nanoNet::NeuralNetworkLayer_*,_std::vector<nanoNet::NeuralNetworkLayer,_std::allocator<nanoNet::NeuralNetworkLayer>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

NeuralNetworkLayer::vector_type NeuralNetwork::predict(
    const NeuralNetworkLayer::vector_type& inputData) const
{
    NeuralNetworkLayer::vector_type result(inputData);

    for (auto& layer : m_layers)
        result = layer.predict(result);

    return result;
}